

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::AddressBook::~AddressBook(AddressBook *this)

{
  AddressBook *this_local;
  
  ~AddressBook(this);
  operator_delete(this);
  return;
}

Assistant:

AddressBook::~AddressBook() {
  // @@protoc_insertion_point(destructor:Messages.AddressBook)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}